

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O3

size_t FSE_normalizeCount(short *normalizedCounter,uint tableLog,uint *count,size_t total,
                         uint maxSymbolValue,uint useLowProbCount)

{
  undefined1 auVar1 [16];
  char cVar2;
  byte bVar3;
  short sVar4;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  ushort uVar8;
  short *psVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  ushort uVar19;
  
  uVar11 = 0xb;
  if (tableLog != 0) {
    uVar11 = (ulong)tableLog;
  }
  uVar17 = (uint)uVar11;
  uVar6 = 0xffffffffffffffff;
  if ((4 < uVar17) && (uVar6 = 0xffffffffffffffd4, uVar17 < 0xd)) {
    uVar5 = FSE_minTableLog(total,maxSymbolValue);
    uVar6 = 0xffffffffffffffff;
    if (uVar5 <= uVar17) {
      uVar19 = -(ushort)(useLowProbCount != 0) | 1;
      bVar3 = (byte)uVar11;
      cVar2 = -bVar3;
      bVar7 = cVar2 + 0x3e;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = total & 0xffffffff;
      uVar5 = 1 << (bVar3 & 0x1f);
      uVar6 = 0;
      uVar16 = 0;
      uVar10 = 0;
      uVar17 = uVar5;
      do {
        uVar15 = (ulong)uVar10;
        uVar14 = (ulong)count[uVar15];
        if (uVar14 == total) {
          return 0;
        }
        uVar18 = (uint)(total >> (bVar3 & 0x3f));
        if (uVar14 == 0) {
          normalizedCounter[uVar15] = 0;
        }
        else if (uVar18 < count[uVar15]) {
          uVar14 = uVar14 * SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x4000000000000000)) / auVar1,0);
          uVar13 = uVar14 >> (bVar7 & 0x3f);
          if ((uVar13 & 0xfff8) == 0) {
            uVar13 = (ulong)((int)uVar13 +
                            (uint)((ulong)FSE_normalizeCount::rtbTable[uVar13 & 0xffff] <<
                                   (cVar2 + 0x2aU & 0x3f) <
                                  uVar14 - ((uVar13 & 0xffff) << (bVar7 & 0x3f))));
          }
          uVar8 = (ushort)uVar13;
          if ((ushort)uVar6 < uVar8) {
            uVar16 = uVar15;
          }
          if ((ushort)uVar6 < uVar8) {
            uVar6 = uVar13 & 0xffff;
          }
          normalizedCounter[uVar15] = uVar8;
          uVar17 = uVar17 - (int)(uVar13 & 0xffff);
        }
        else {
          normalizedCounter[uVar15] = uVar19;
          uVar17 = uVar17 - 1;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 <= maxSymbolValue);
      sVar4 = normalizedCounter[uVar16];
      iVar12 = (int)sVar4 >> 1;
      if (iVar12 == -uVar17 || SBORROW4(iVar12,-uVar17) != (int)(iVar12 + uVar17) < 0) {
        uVar15 = total * 3 >> (bVar3 + 1 & 0x3f);
        uVar16 = (ulong)(maxSymbolValue + 1);
        uVar6 = 0;
        uVar10 = 0;
        do {
          uVar17 = count[uVar6];
          if ((ulong)uVar17 == 0) {
            normalizedCounter[uVar6] = 0;
          }
          else {
            if (uVar18 < uVar17) {
              if ((uint)uVar15 < uVar17) {
                normalizedCounter[uVar6] = -2;
                goto LAB_007bc304;
              }
              normalizedCounter[uVar6] = 1;
            }
            else {
              normalizedCounter[uVar6] = uVar19;
            }
            uVar10 = uVar10 + 1;
            total = total - uVar17;
          }
LAB_007bc304:
          uVar6 = uVar6 + 1;
        } while (uVar16 != uVar6);
        uVar17 = uVar5 - uVar10;
        if (uVar17 == 0) {
          return uVar11;
        }
        if ((uVar15 & 0xffffffff) < total / uVar17) {
          uVar6 = total * 3;
          uVar15 = 0;
          do {
            if ((normalizedCounter[uVar15] == -2) &&
               (uVar18 = count[uVar15], uVar18 <= (uint)(uVar6 / (uVar17 * 2)))) {
              normalizedCounter[uVar15] = 1;
              uVar10 = uVar10 + 1;
              total = total - uVar18;
            }
            uVar15 = uVar15 + 1;
          } while (uVar16 != uVar15);
          uVar17 = uVar5 - uVar10;
        }
        if (uVar10 != maxSymbolValue + 1) {
          if (total == 0) {
            if (uVar17 == 0) {
              return uVar11;
            }
            uVar6 = 0;
            do {
              if (0 < normalizedCounter[uVar6]) {
                uVar17 = uVar17 - 1;
                normalizedCounter[uVar6] = normalizedCounter[uVar6] + 1;
              }
              uVar5 = (uint)uVar6;
              uVar6 = (ulong)(uVar5 + 1);
              if (uVar5 == maxSymbolValue) {
                uVar6 = 0;
              }
            } while (uVar17 != 0);
            return uVar11;
          }
          uVar16 = ~(-1L << (cVar2 + 0x3dU & 0x3f));
          uVar5 = 0;
          uVar6 = uVar16;
          do {
            uVar15 = uVar6;
            if (normalizedCounter[uVar5] == -2) {
              uVar15 = (ulong)count[uVar5] *
                       ((((ulong)uVar17 << (bVar7 & 0x3f)) + uVar16) / (total & 0xffffffff)) + uVar6
              ;
              uVar6 = uVar6 >> (bVar7 & 0x3f);
              uVar14 = uVar15 >> (bVar7 & 0x3f);
              if (uVar14 == uVar6) {
                return 0xffffffffffffffff;
              }
              normalizedCounter[uVar5] = (short)uVar14 - (short)uVar6;
            }
            uVar5 = uVar5 + 1;
            uVar6 = uVar15;
          } while (uVar5 <= maxSymbolValue);
          return uVar11;
        }
        uVar15 = 0;
        uVar5 = 0;
        uVar6 = 0;
        do {
          if (uVar5 < count[uVar15]) {
            uVar6 = uVar15 & 0xffffffff;
            uVar5 = count[uVar15];
          }
          uVar15 = uVar15 + 1;
        } while (uVar16 != uVar15);
        psVar9 = normalizedCounter + uVar6;
        sVar4 = *psVar9;
      }
      else {
        psVar9 = normalizedCounter + uVar16;
      }
      *psVar9 = sVar4 + (short)uVar17;
      uVar6 = uVar11;
    }
  }
  return uVar6;
}

Assistant:

size_t FSE_normalizeCount (short* normalizedCounter, unsigned tableLog,
                           const unsigned* count, size_t total,
                           unsigned maxSymbolValue, unsigned useLowProbCount)
{
    /* Sanity checks */
    if (tableLog==0) tableLog = FSE_DEFAULT_TABLELOG;
    if (tableLog < FSE_MIN_TABLELOG) return ERROR(GENERIC);   /* Unsupported size */
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);   /* Unsupported size */
    if (tableLog < FSE_minTableLog(total, maxSymbolValue)) return ERROR(GENERIC);   /* Too small tableLog, compression potentially impossible */

    {   static U32 const rtbTable[] = {     0, 473195, 504333, 520860, 550000, 700000, 750000, 830000 };
        short const lowProbCount = useLowProbCount ? -1 : 1;
        U64 const scale = 62 - tableLog;
        U64 const step = ZSTD_div64((U64)1<<62, (U32)total);   /* <== here, one division ! */
        U64 const vStep = 1ULL<<(scale-20);
        int stillToDistribute = 1<<tableLog;
        unsigned s;
        unsigned largest=0;
        short largestP=0;
        U32 lowThreshold = (U32)(total >> tableLog);

        for (s=0; s<=maxSymbolValue; s++) {
            if (count[s] == total) return 0;   /* rle special case */
            if (count[s] == 0) { normalizedCounter[s]=0; continue; }
            if (count[s] <= lowThreshold) {
                normalizedCounter[s] = lowProbCount;
                stillToDistribute--;
            } else {
                short proba = (short)((count[s]*step) >> scale);
                if (proba<8) {
                    U64 restToBeat = vStep * rtbTable[proba];
                    proba += (count[s]*step) - ((U64)proba<<scale) > restToBeat;
                }
                if (proba > largestP) { largestP=proba; largest=s; }
                normalizedCounter[s] = proba;
                stillToDistribute -= proba;
        }   }
        if (-stillToDistribute >= (normalizedCounter[largest] >> 1)) {
            /* corner case, need another normalization method */
            size_t const errorCode = FSE_normalizeM2(normalizedCounter, tableLog, count, total, maxSymbolValue, lowProbCount);
            if (FSE_isError(errorCode)) return errorCode;
        }
        else normalizedCounter[largest] += (short)stillToDistribute;
    }

#if 0
    {   /* Print Table (debug) */
        U32 s;
        U32 nTotal = 0;
        for (s=0; s<=maxSymbolValue; s++)
            RAWLOG(2, "%3i: %4i \n", s, normalizedCounter[s]);
        for (s=0; s<=maxSymbolValue; s++)
            nTotal += abs(normalizedCounter[s]);
        if (nTotal != (1U<<tableLog))
            RAWLOG(2, "Warning !!! Total == %u != %u !!!", nTotal, 1U<<tableLog);
        getchar();
    }
#endif

    return tableLog;
}